

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int initialize(lexicon_t **out_lex,model_def_t **out_mdef,int argc,char **argv)

{
  int iVar1;
  int32 iVar2;
  cmd_ln_t *pcVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  uint32 *puVar7;
  uint local_5c;
  char *pcStack_58;
  uint32 n_ts;
  char *ts2cbfn;
  char *dictfn;
  char *fdictfn;
  model_def_t *mdef;
  lexicon_t *lex;
  char **argv_local;
  model_def_t **ppmStack_20;
  int argc_local;
  model_def_t **out_mdef_local;
  lexicon_t **out_lex_local;
  
  lex = (lexicon_t *)argv;
  argv_local._4_4_ = argc;
  ppmStack_20 = out_mdef;
  out_mdef_local = (model_def_t **)out_lex;
  parse_cmd_ln(argc,argv);
  pcVar3 = cmd_ln_get();
  pcVar4 = cmd_ln_str_r(pcVar3,"-segdir");
  corpus_set_seg_dir(pcVar4);
  pcVar3 = cmd_ln_get();
  pcVar4 = cmd_ln_str_r(pcVar3,"-segext");
  corpus_set_seg_ext(pcVar4);
  pcVar3 = cmd_ln_get();
  pcVar4 = cmd_ln_str_r(pcVar3,"-lsnfn");
  if (pcVar4 == (char *)0x0) {
    pcVar3 = cmd_ln_get();
    pcVar4 = cmd_ln_str_r(pcVar3,"-sentdir");
    corpus_set_sent_dir(pcVar4);
    pcVar3 = cmd_ln_get();
    pcVar4 = cmd_ln_str_r(pcVar3,"-sentext");
    corpus_set_sent_ext(pcVar4);
  }
  else {
    pcVar3 = cmd_ln_get();
    pcVar4 = cmd_ln_str_r(pcVar3,"-lsnfn");
    corpus_set_lsn_filename(pcVar4);
  }
  pcVar3 = cmd_ln_get();
  pcVar4 = cmd_ln_str_r(pcVar3,"-ctlfn");
  corpus_set_ctl_filename(pcVar4);
  pcVar3 = cmd_ln_get();
  lVar5 = cmd_ln_int_r(pcVar3,"-nskip");
  if ((int)lVar5 != 0) {
    pcVar3 = cmd_ln_get();
    lVar5 = cmd_ln_int_r(pcVar3,"-runlen");
    if ((int)lVar5 != 0) {
      pcVar3 = cmd_ln_get();
      lVar5 = cmd_ln_int_r(pcVar3,"-nskip");
      pcVar3 = cmd_ln_get();
      lVar6 = cmd_ln_int_r(pcVar3,"-runlen");
      corpus_set_interval((uint32)lVar5,(uint32)lVar6);
      goto LAB_00102c89;
    }
  }
  pcVar3 = cmd_ln_get();
  lVar5 = cmd_ln_int_r(pcVar3,"-part");
  if ((int)lVar5 != 0) {
    pcVar3 = cmd_ln_get();
    lVar5 = cmd_ln_int_r(pcVar3,"-npart");
    if ((int)lVar5 != 0) {
      pcVar3 = cmd_ln_get();
      lVar5 = cmd_ln_int_r(pcVar3,"-part");
      pcVar3 = cmd_ln_get();
      lVar6 = cmd_ln_int_r(pcVar3,"-npart");
      corpus_set_partition((uint32)lVar5,(uint32)lVar6);
    }
  }
LAB_00102c89:
  iVar1 = corpus_init();
  if (iVar1 == 0) {
    pcVar3 = cmd_ln_get();
    pcVar4 = cmd_ln_str_r(pcVar3,"-moddeffn");
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/param_cnt/main.c"
            ,0x69,"Reading: %s\n",pcVar4);
    pcVar3 = cmd_ln_get();
    pcVar4 = cmd_ln_str_r(pcVar3,"-moddeffn");
    iVar2 = model_def_read((model_def_t **)&fdictfn,pcVar4);
    if (iVar2 == 0) {
      pcVar3 = cmd_ln_get();
      pcStack_58 = cmd_ln_str_r(pcVar3,"-ts2cbfn");
      if (pcStack_58 != (char *)0x0) {
        pcVar3 = cmd_ln_get();
        pcVar4 = cmd_ln_str_r(pcVar3,"-ts2cbfn");
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/param_cnt/main.c"
                ,0x74,"Reading %s\n",pcVar4);
        iVar1 = strcmp(pcStack_58,".semi.");
        if (iVar1 == 0) {
          puVar7 = semi_ts2cb(*(uint32 *)(fdictfn + 0x1c));
          *(uint32 **)(fdictfn + 0x28) = puVar7;
          local_5c = *(uint *)(fdictfn + 0x1c);
          fdictfn[0x30] = '\x01';
          fdictfn[0x31] = '\0';
          fdictfn[0x32] = '\0';
          fdictfn[0x33] = '\0';
        }
        else {
          iVar1 = strcmp(pcStack_58,".cont.");
          if (iVar1 == 0) {
            puVar7 = cont_ts2cb(*(uint32 *)(fdictfn + 0x1c));
            *(uint32 **)(fdictfn + 0x28) = puVar7;
            local_5c = *(uint *)(fdictfn + 0x1c);
            *(undefined4 *)(fdictfn + 0x30) = *(undefined4 *)(fdictfn + 0x1c);
          }
          else {
            iVar1 = strcmp(".ptm.",pcStack_58);
            if (iVar1 == 0) {
              puVar7 = ptm_ts2cb((model_def_t *)fdictfn);
              *(uint32 **)(fdictfn + 0x28) = puVar7;
              local_5c = *(uint *)(fdictfn + 0x1c);
              *(undefined4 *)(fdictfn + 0x30) = *(undefined4 *)(*(long *)fdictfn + 8);
            }
            else {
              pcVar3 = cmd_ln_get();
              pcVar4 = cmd_ln_str_r(pcVar3,"-ts2cbfn");
              iVar1 = s3ts2cb_read(pcVar4,(uint32 **)(fdictfn + 0x28),&local_5c,
                                   (uint32 *)(fdictfn + 0x30));
              if (iVar1 != 0) {
                return -1;
              }
            }
          }
        }
        if (local_5c != *(uint *)(fdictfn + 0x1c)) {
          err_msg(ERR_WARN,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/param_cnt/main.c"
                  ,0x8e,"# of tied states in ts2cb mapping, %u != # tied states in model def, %u\n",
                  (ulong)local_5c,(ulong)*(uint *)(fdictfn + 0x1c));
        }
      }
      *ppmStack_20 = (model_def_t *)fdictfn;
      pcVar3 = cmd_ln_get();
      ts2cbfn = cmd_ln_str_r(pcVar3,"-dictfn");
      if (ts2cbfn == (char *)0x0) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/param_cnt/main.c"
                ,0x98,"You must specify a content dictionary using -dictfn\n");
        exit(1);
      }
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/param_cnt/main.c"
              ,0x9b,"Reading: %s\n",ts2cbfn);
      mdef = (model_def_t *)lexicon_read((lexicon_t *)0x0,ts2cbfn,*(acmod_set_t **)fdictfn);
      if (mdef == (model_def_t *)0x0) {
        out_lex_local._4_4_ = -1;
      }
      else {
        pcVar3 = cmd_ln_get();
        dictfn = cmd_ln_str_r(pcVar3,"-fdictfn");
        if (dictfn != (char *)0x0) {
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/param_cnt/main.c"
                  ,0xa6,"Reading: %s\n",dictfn);
          lexicon_read((lexicon_t *)mdef,dictfn,*(acmod_set_t **)fdictfn);
        }
        *out_mdef_local = mdef;
        out_lex_local._4_4_ = 0;
      }
    }
    else {
      out_lex_local._4_4_ = -1;
    }
  }
  else {
    out_lex_local._4_4_ = -1;
  }
  return out_lex_local._4_4_;
}

Assistant:

static int
initialize(lexicon_t **out_lex,
	   model_def_t **out_mdef,
	   int argc,
	   char *argv[])
{
    lexicon_t *lex;
    model_def_t *mdef;
    const char *fdictfn;
    const char *dictfn;
    const char *ts2cbfn;
    uint32 n_ts;

    /* define, parse and (partially) validate the command line */
    parse_cmd_ln(argc, argv);

    corpus_set_seg_dir(cmd_ln_str("-segdir"));
    corpus_set_seg_ext(cmd_ln_str("-segext"));

    if (cmd_ln_str("-lsnfn"))
	corpus_set_lsn_filename(cmd_ln_str("-lsnfn"));
    else {
	corpus_set_sent_dir(cmd_ln_str("-sentdir"));
	corpus_set_sent_ext(cmd_ln_str("-sentext"));
    }

    corpus_set_ctl_filename(cmd_ln_str("-ctlfn"));

    if (cmd_ln_int32("-nskip") && cmd_ln_int32("-runlen")) {
        corpus_set_interval(cmd_ln_int32("-nskip"),
			    cmd_ln_int32("-runlen"));
    } else if (cmd_ln_int32("-part") && cmd_ln_int32("-npart")) {
	corpus_set_partition(cmd_ln_int32("-part"),
			     cmd_ln_int32("-npart"));
    }
    
    if (corpus_init() != S3_SUCCESS) {
	return S3_ERROR;
    }
    
    E_INFO("Reading: %s\n", cmd_ln_str("-moddeffn"));
    
    /* Read in the model definitions.  Defines the set of
       CI phones and context dependent phones.  Defines the
       transition matrix tying and state level tying. */
    if (model_def_read(&mdef, cmd_ln_str("-moddeffn")) != S3_SUCCESS) {
	return S3_ERROR;
    }

    ts2cbfn = cmd_ln_str("-ts2cbfn");
    if (ts2cbfn) {
	E_INFO("Reading %s\n", cmd_ln_str("-ts2cbfn"));

	       
	if (strcmp(ts2cbfn, SEMI_LABEL) == 0) {		/* see <s3/ts2cb.h> */
	    mdef->cb = semi_ts2cb(mdef->n_tied_state);
	    n_ts = mdef->n_tied_state;
	    mdef->n_cb = 1;
	}
	else if (strcmp(ts2cbfn, CONT_LABEL) == 0) {	/* see <s3/ts2cb.h> */
	    mdef->cb = cont_ts2cb(mdef->n_tied_state);
	    n_ts = mdef->n_tied_state;
	    mdef->n_cb = mdef->n_tied_state;
	}
	else if (strcmp(PTM_LABEL, ts2cbfn) == 0) {
	    mdef->cb = ptm_ts2cb(mdef);
	    n_ts = mdef->n_tied_state;
	    mdef->n_cb = mdef->acmod_set->n_ci;
	}
	else if (s3ts2cb_read(cmd_ln_str("-ts2cbfn"),
			      &mdef->cb,
			      &n_ts,
			      &mdef->n_cb) != S3_SUCCESS) {
	    return S3_ERROR;
	}

	if (n_ts != mdef->n_tied_state) {
	    E_WARN("# of tied states in ts2cb mapping, %u != # tied states in model def, %u\n", n_ts, mdef->n_tied_state);
	}

    }

    *out_mdef = mdef;
    
    dictfn = cmd_ln_str("-dictfn");

    if (dictfn == NULL) {
	E_FATAL("You must specify a content dictionary using -dictfn\n");
    }

    E_INFO("Reading: %s\n", dictfn);

    lex = lexicon_read(NULL,	/* no lexicon to start */
		       dictfn,
		       mdef->acmod_set);
    if (lex == NULL)
	return S3_ERROR;
    
    fdictfn = cmd_ln_str("-fdictfn");

    if (fdictfn) {
	E_INFO("Reading: %s\n", fdictfn);

	(void)lexicon_read(lex,	/* add filler words content lexicon */
			   fdictfn,
			   mdef->acmod_set);
    }

    *out_lex = lex;

    return S3_SUCCESS;
}